

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O1

QString * qt_accStripAmp(QString *__return_storage_ptr__,QString *text)

{
  Data *pDVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  long in_FS_OFFSET;
  QLatin1String QVar6;
  QLatin1String QVar7;
  QArrayData *local_48;
  char16_t *pcStack_40;
  long local_38;
  QStringView local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &((text->d).d)->super_QArrayData;
  pcStack_40 = (text->d).ptr;
  local_38 = (text->d).size;
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_48->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_48->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lVar5 = -1;
  lVar3 = lVar5;
  if ((local_38 != 0) &&
     (local_30.m_size = local_38, local_30.m_data = pcStack_40,
     lVar2 = QStringView::indexOf(&local_30,(QChar)0x26,0,CaseSensitive), lVar2 != -1)) {
    do {
      lVar3 = lVar2 + 1;
      if (lVar3 < local_38) {
        lVar3 = lVar2;
        if (pcStack_40[lVar2 + 1] != L'&') break;
        lVar3 = lVar2 + 2;
      }
      local_30.m_size = local_38;
      local_30.m_data = pcStack_40;
      lVar2 = QStringView::indexOf(&local_30,(QChar)0x26,lVar3,CaseSensitive);
      lVar3 = lVar5;
    } while (lVar2 != -1);
  }
  if (lVar3 != -1) {
    QString::remove((longlong)&local_48,lVar3);
  }
  QVar6.m_data = (char *)0x2;
  QVar6.m_size = (qsizetype)&local_48;
  QVar7.m_data = (char *)0x1;
  QVar7.m_size = (qsizetype)"&&";
  plVar4 = (long *)QString::replace(QVar6,QVar7,0x6e2915);
  pDVar1 = (Data *)*plVar4;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (char16_t *)plVar4[1];
  (__return_storage_ptr__->d).size = plVar4[2];
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString qt_accStripAmp(const QString &text)
{
    QString newText(text);
    qsizetype ampIndex = qt_accAmpIndex(newText);
    if (ampIndex != -1)
        newText.remove(ampIndex, 1);

    return newText.replace("&&"_L1, "&"_L1);
}